

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_pack.cc
# Opt level: O2

void * ASN1_item_unpack(ASN1_STRING *oct,ASN1_ITEM *it)

{
  ASN1_VALUE *val;
  uchar *p;
  
  p = oct->data;
  val = ASN1_item_d2i((ASN1_VALUE **)0x0,&p,(long)oct->length,it);
  if ((val == (ASN1_VALUE *)0x0) || (p != oct->data + oct->length)) {
    ERR_put_error(0xc,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn_pack.cc"
                  ,0x33);
    ASN1_item_free(val,it);
    val = (ASN1_VALUE *)0x0;
  }
  return val;
}

Assistant:

void *ASN1_item_unpack(const ASN1_STRING *oct, const ASN1_ITEM *it) {
  const unsigned char *p = oct->data;
  void *ret = ASN1_item_d2i(NULL, &p, oct->length, it);
  if (ret == NULL || p != oct->data + oct->length) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ret), it);
    return NULL;
  }
  return ret;
}